

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase *
EvaluateFunctionContextAccess(ExpressionEvalContext *ctx,ExprFunctionContextAccess *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  _func_int **pp_Var4;
  bool bVar5;
  int iVar6;
  StackFrame **ppSVar7;
  undefined4 extraout_var;
  ExprPointerLiteral *target;
  ExprBase *pEVar8;
  undefined4 extraout_var_00;
  
  if (((ctx->stackFrames).count != 0) &&
     (ppSVar7 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar7)->targetYield != 0)) {
    pAVar1 = ctx->ctx->allocator;
    iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = pSVar2;
    pEVar8->type = pTVar3;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223678;
    return pEVar8;
  }
  bVar5 = AddInstruction(ctx);
  if (!bVar5) {
    return (ExprBase *)0x0;
  }
  target = FindVariableStorage(ctx,expression->contextVariable,false);
  if (target == (ExprPointerLiteral *)0x0) {
    return (ExprBase *)0x0;
  }
  pTVar3 = expression->function->contextType;
  if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                  ,0x766,
                  "ExprBase *EvaluateFunctionContextAccess(ExpressionEvalContext &, ExprFunctionContextAccess *)"
                 );
  }
  pp_Var4 = pTVar3[1]._vptr_TypeBase;
  if ((pp_Var4 != (_func_int **)0x0) && (*(int *)(pp_Var4 + 1) == 0x18)) {
    if (pp_Var4[0xd] == (_func_int *)0x0) {
      pAVar1 = ctx->ctx->allocator;
      iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
      pSVar2 = (expression->super_ExprBase).source;
      pTVar3 = expression->function->contextType;
      pEVar8->typeID = 9;
      pEVar8->source = pSVar2;
      pEVar8->type = pTVar3;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002235d0;
    }
    else {
      pEVar8 = CreateLoad(ctx,&target->super_ExprBase);
      if (pEVar8 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
    }
    pEVar8 = CheckType(&expression->super_ExprBase,pEVar8);
    return pEVar8;
  }
  __assert_fail("classType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                ,0x76a,
                "ExprBase *EvaluateFunctionContextAccess(ExpressionEvalContext &, ExprFunctionContextAccess *)"
               );
}

Assistant:

ExprBase* EvaluateFunctionContextAccess(ExpressionEvalContext &ctx, ExprFunctionContextAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *ptr = FindVariableStorage(ctx, expression->contextVariable, false);

	if(!ptr)
		return NULL;

	ExprBase *value = NULL;

	TypeRef *refType = getType<TypeRef>(expression->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	if(classType->members.empty())
		value = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->function->contextType);
	else
		value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	return CheckType(expression, value);
}